

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3stm.cpp
# Opt level: O0

void __thiscall CTPNVarInRange::gen_code(CTPNVarInRange *this,int param_2,int param_3)

{
  int iVar1;
  char *str;
  CTcSymLocal *this_00;
  long in_RDI;
  undefined4 uVar2;
  undefined4 in_stack_ffffffffffffffac;
  undefined4 uVar3;
  int in_stack_ffffffffffffffb4;
  undefined8 uVar4;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 uVar5;
  
  uVar2 = 0;
  uVar3 = 1;
  uVar4 = 0;
  (**(code **)(**(long **)(in_RDI + 0x10) + 0x90))
            (*(long **)(in_RDI + 0x10),1,1,0,"=",*(undefined8 *)(in_RDI + 0x18));
  iVar1 = CTcPrsNodeBase::is_const((CTcPrsNodeBase *)0x289d84);
  if (iVar1 == 0) {
    (**(code **)**(undefined8 **)(in_RDI + 0x20))(*(undefined8 **)(in_RDI + 0x20),0);
    CTcSymLocal::s_gen_code_setlcl_stk(0,0x289daa);
  }
  if (*(long *)(in_RDI + 0x28) != 0) {
    iVar1 = CTcPrsNodeBase::is_const((CTcPrsNodeBase *)0x289dc8);
    if (iVar1 == 0) {
      uVar5 = 0;
      (**(code **)**(undefined8 **)(in_RDI + 0x28))(*(undefined8 **)(in_RDI + 0x28),0);
      CTcSymLocal::s_gen_code_setlcl_stk(0,0x289dfb);
      str = (char *)CTcPrsAllocObj::operator_new(0x289e05);
      this_00 = (CTcSymLocal *)CTcSymbolBase::operator_new(0x289e14);
      CTcSymLocal::CTcSymLocal
                (this_00,str,CONCAT44(uVar5,in_stack_ffffffffffffffc0),(int)((ulong)uVar4 >> 0x20),
                 (int)uVar4,in_stack_ffffffffffffffb4);
      CTPNSymResolved::CTPNSymResolved
                ((CTPNSymResolved *)CONCAT44(in_stack_ffffffffffffffb4,uVar3),
                 (CTcSymbol *)CONCAT44(in_stack_ffffffffffffffac,uVar2));
      *(char **)(in_RDI + 0x28) = str;
    }
  }
  return;
}

Assistant:

void CTPNVarInRange::gen_code(int, int)
{
    /* assign the 'from' expression to the lvalue */
    lval_->gen_code_asi(TRUE, 1, TC_ASI_SIMPLE, "=", from_expr_,
                        FALSE, TRUE, 0);

    /* 
     *   if the 'to' expression is non-constant, evaluate it and save it in a
     *   local, so that we don't have to re-evaluate it on each iteration 
     */
    if (!to_expr_->is_const())
    {
        /* evaluate the 'to' expression */
        to_expr_->gen_code(FALSE, FALSE);

        /* assign it to our stack local */
        CTcSymLocal::s_gen_code_setlcl_stk(to_local_id_, FALSE);
    }

    /* 
     *   likewise, if there's a non-constant 'step' expression, evaluate it
     *   and store it in our step stack local 
     */
    if (step_expr_ != 0 && !step_expr_->is_const())
    {
        /* generate the step expression value */
        step_expr_->gen_code(FALSE, FALSE);

        /* generate the assignment to our local */
        CTcSymLocal::s_gen_code_setlcl_stk(step_local_id_, FALSE);

        /* replace the step expression with the local */
        step_expr_ = new CTPNSymResolved(new CTcSymLocal(
            ".step", 5, FALSE, FALSE, step_local_id_));
    }
}